

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  byte *in_RSI;
  InternalInstruction *in_RDI;
  uint8_t valid;
  uint8_t local_19 [9];
  InternalInstruction *local_10;
  
  uVar2 = (uint)*in_RSI;
  local_10 = in_RDI;
  if (uVar2 == 1) {
    bVar1 = fixupRegValue(in_RDI,(uint)in_RSI[1],(char)in_RDI->reg - (char)in_RDI->regBase,local_19)
    ;
    local_10->reg = (uint)bVar1;
    if (local_19[0] == '\0') {
      return -1;
    }
  }
  else if (uVar2 - 2 < 7) {
    if (in_RDI->eaRegBase <= in_RDI->eaBase) {
      bVar1 = fixupRMValue(in_RDI,(uint)in_RSI[1],(char)in_RDI->eaBase - (char)in_RDI->eaRegBase,
                           local_19);
      local_10->eaBase = (uint)bVar1;
      if (local_19[0] == '\0') {
        return -1;
      }
    }
  }
  else {
    if (uVar2 != 9) {
      return -1;
    }
    bVar1 = fixupRegValue(in_RDI,(uint)in_RSI[1],(uint8_t)in_RDI->vvvv,local_19);
    local_10->vvvv = (uint)bVar1;
    if (local_19[0] == '\0') {
      return -1;
    }
  }
  return 0;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}